

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::RenderTex2DCase::iterate(RenderTex2DCase *this)

{
  pointer *ppVVar1;
  size_type *psVar2;
  RenderContext *renderCtx;
  TestLog *log;
  pointer pVVar3;
  RenderTex2DCase *pRVar4;
  bool bVar5;
  int iVar6;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer __dest;
  undefined4 extraout_var_03;
  TestError *this_00;
  long lVar9;
  long lVar10;
  char *description;
  long lVar11;
  unsigned_short uVar12;
  int iVar13;
  unsigned_short uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> rects;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  size_type __dnew;
  Texture depthStencilTex;
  Renderbuffer colorBuf;
  Framebuffer fbo;
  VertexArrayBinding posBinding;
  TextureLevel reference;
  TextureLevel result;
  ShaderProgram program;
  undefined1 local_328 [32];
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_308;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_2e8;
  undefined1 local_2d0 [8];
  value_type local_2c8;
  undefined4 local_2a8;
  size_type *local_2a0;
  value_type local_298;
  RenderTex2DCase *local_278;
  Functions *local_270;
  ObjectWrapper local_268;
  ObjectWrapper local_250;
  ObjectWrapper local_238;
  undefined1 local_220 [8];
  _Alloc_hider local_218;
  undefined1 local_210 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  pointer local_1d8;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_190;
  undefined1 local_170 [32];
  TextureLevel local_150;
  TextureLevel local_128;
  ShaderProgram local_100;
  Functions *pFVar7;
  
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar6 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  pFVar7 = (Functions *)CONCAT44(extraout_var,iVar6);
  iVar6 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  pOVar8 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_238,(Functions *)CONCAT44(extraout_var_00,iVar6),pOVar8);
  iVar6 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  pOVar8 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_250,(Functions *)CONCAT44(extraout_var_01,iVar6),pOVar8);
  iVar6 = (*renderCtx->_vptr_RenderContext[3])();
  pOVar8 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper(&local_268,(Functions *)CONCAT44(extraout_var_02,iVar6),pOVar8);
  local_100.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x2100000008;
  tcu::TextureLevel::TextureLevel(&local_128,(TextureFormat *)&local_100,0x75,0xc1,1);
  local_100.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1e00000013;
  tcu::TextureLevel::TextureLevel(&local_150,(TextureFormat *)&local_100,0x75,0xc1,1);
  checkDepthStencilFormatSupport((this->super_TestCase).m_context,this->m_format);
  (*pFVar7->bindRenderbuffer)(0x8d41,local_250.m_object);
  (*pFVar7->renderbufferStorage)(0x8d41,0x8236,0x75,0xc1);
  (*pFVar7->bindTexture)(0xde1,local_268.m_object);
  (*pFVar7->texStorage2D)(0xde1,1,this->m_format,0x75,0xc1);
  (*pFVar7->bindFramebuffer)(0x8d40,local_238.m_object);
  (*pFVar7->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,local_250.m_object);
  (*pFVar7->framebufferTexture2D)(0x8d40,0x821a,0xde1,local_268.m_object,0);
  checkFramebufferStatus(pFVar7);
  local_170[0x10] = 0;
  local_170._17_8_ = 0;
  local_170._0_8_ = (pointer)0x0;
  local_170[8] = 0;
  local_170._9_7_ = 0;
  memset(local_220,0,0xac);
  local_2a0 = (size_type *)&DAT_0000005a;
  local_328._0_8_ = (pointer)(local_328 + 0x10);
  __dest = (pointer)std::__cxx11::string::_M_create((ulong *)local_328,(ulong)&local_2a0);
  psVar2 = local_2a0;
  local_328._16_8_ = local_2a0;
  local_328._0_8_ = __dest;
  memcpy(__dest,
         "#version 300 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
         ,0x5a);
  local_328._8_8_ = psVar2;
  *(undefined1 *)((long)__dest->m_data + (long)psVar2) = 0;
  local_2d0._0_4_ = PRIMITIVETYPE_TRIANGLES;
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c8,local_328._0_8_,
             (undefined1 *)((long)(int *)psVar2 + local_328._0_8_));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_220 + (ulong)(uint)local_2d0._0_4_ * 0x18),&local_2c8);
  ppVVar1 = &local_308.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x24;
  local_308.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)ppVVar1;
  local_270 = pFVar7;
  local_308.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_308,(ulong)&local_2e8);
  local_308.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_2e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)
   local_308.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
   _M_impl.super__Vector_impl_data._M_start[2].m_data = 0x69616d2064696f76;
  *(undefined8 *)
   local_308.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
   _M_impl.super__Vector_impl_data._M_start[3].m_data = 0x2964696f7628206e;
  (local_308.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
   _M_impl.super__Vector_impl_data._M_start)->m_data[0] = (float)0x72657623;
  (local_308.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
   _M_impl.super__Vector_impl_data._M_start)->m_data[1] = (float)0x6e6f6973;
  local_308.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start[1].m_data[0] = (float)0x30303320;
  local_308.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start[1].m_data[1] = (float)0xa736520;
  local_308.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start[4].m_data[0] = 1.2204664e-32;
  local_308.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_2e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start;
  *(undefined1 *)
   ((long)(local_308.
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start)->m_data +
   (long)local_2e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_start) = 0;
  local_2a0 = (size_type *)CONCAT44(local_2a0._4_4_,1);
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,
             local_308.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (undefined1 *)
             ((long)(float *)local_2e8.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start +
             (long)local_308.
                   super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                   ._M_impl.super__Vector_impl_data._M_start));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_220 + ((ulong)local_2a0 & 0xffffffff) * 0x18),&local_298);
  glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,
                    CONCAT53(local_298.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_298.field_2._M_local_buf[2],
                                      local_298.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if (local_308.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)ppVVar1) {
    operator_delete(local_308.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)(local_308.
                                   super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_328._0_8_ != (pointer)(local_328 + 0x10)) {
    operator_delete((void *)local_328._0_8_,(ulong)((long)(int *)local_328._16_8_ + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_170);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_190);
  lVar11 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_220 + lVar11));
    lVar11 = lVar11 + -0x18;
  } while (lVar11 != -0x18);
  iVar6 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  lVar11 = CONCAT44(extraout_var_03,iVar6);
  local_328._0_8_ = (pointer)0x0;
  local_328._8_8_ = (pointer)0x0;
  local_328._16_8_ = (pointer)0x0;
  local_308.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_308.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_308.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (local_100.m_program.m_info.linkOk != false) {
    (**(code **)(lVar11 + 0x1680))(local_100.m_program.m_program);
    (**(code **)(lVar11 + 0x1a00))(0,0,0x75,0xc1);
    (**(code **)(lVar11 + 0x188))(0x400);
    (**(code **)(lVar11 + 0x5e0))(0xb90);
    (**(code **)(lVar11 + 0x12e8))(0x1e00,0x1e00,0x8507);
    (**(code **)(lVar11 + 0x12c8))(0x207,0,0xffffffff);
    err = (**(code **)(lVar11 + 0x800))();
    glu::checkError(err,"State setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                    ,0x97);
    genTestRects((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_328,
                 0x75,0xc1);
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::resize
              (&local_308,(long)(local_328._8_8_ - local_328._0_8_) >> 2);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              (&local_2e8,((long)(local_328._8_8_ - local_328._0_8_) >> 3) * 3);
    pVVar3 = local_308.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_1d8 = (pointer)local_308.
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)(local_328._8_8_ - local_328._0_8_) >> 4)) {
      iVar6 = 5;
      lVar9 = 0;
      lVar10 = 0;
      do {
        fVar15 = (float)(((int *)local_328._0_8_)[lVar9] * 2) / 117.0 + -1.0;
        fVar16 = (float)((((int *)local_328._0_8_)[lVar9] + ((int *)local_328._0_8_)[lVar9 + 2]) * 2
                        ) / 117.0 + -1.0;
        fVar17 = (float)(((int *)local_328._0_8_)[lVar9 + 1] * 2) / 193.0 + -1.0;
        fVar18 = (float)((((int *)local_328._0_8_)[lVar9 + 1] + ((int *)local_328._0_8_)[lVar9 + 3])
                        * 2) / 193.0 + -1.0;
        *(float *)&((_Alloc_hider *)
                   (local_308.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_data)[(int)lVar9]._M_p = fVar15;
        *(float *)((long)&((_Alloc_hider *)
                          (local_308.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data)[(int)lVar9]._M_p + 4)
             = fVar17;
        iVar13 = (int)(lVar9 + 1);
        *(float *)&((_Alloc_hider *)
                   (local_308.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_data)[iVar13]._M_p = fVar16;
        *(float *)((long)&((_Alloc_hider *)
                          (local_308.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data)[iVar13]._M_p + 4) =
             fVar17;
        iVar13 = (int)(lVar9 + 2);
        *(float *)&((_Alloc_hider *)
                   (local_308.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_data)[iVar13]._M_p = fVar15;
        *(float *)((long)&((_Alloc_hider *)
                          (local_308.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data)[iVar13]._M_p + 4) =
             fVar18;
        iVar13 = (int)(lVar9 + 3);
        *(float *)&((_Alloc_hider *)
                   (local_308.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_data)[iVar13]._M_p = fVar16;
        *(float *)((long)&((_Alloc_hider *)
                          (local_308.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data)[iVar13]._M_p + 4) =
             fVar18;
        local_2e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start[iVar6 + -5] = (unsigned_short)lVar9;
        uVar12 = (unsigned_short)(lVar9 + 1);
        local_2e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start[iVar6 + -4] = uVar12;
        uVar14 = (unsigned_short)(lVar9 + 2);
        local_2e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start[iVar6 + -3] = uVar14;
        local_2e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start[iVar6 + -2] = uVar14;
        local_2e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start[iVar6 + -1] = uVar12;
        local_2e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start[iVar6] = (unsigned_short)(lVar9 + 3);
        lVar10 = lVar10 + 1;
        iVar6 = iVar6 + 6;
        lVar9 = lVar9 + 4;
      } while (lVar10 < (int)((ulong)(local_328._8_8_ - local_328._0_8_) >> 4));
    }
    psVar2 = &local_298._M_string_length;
    local_298._M_string_length = 0x697469736f705f61;
    local_298.field_2._M_allocated_capacity._0_2_ = 0x6e6f;
    local_298._M_dataplus._M_p = (pointer)0xa;
    local_298.field_2._M_local_buf[2] = '\0';
    local_2d0._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    local_2a0 = psVar2;
    local_278 = this;
    std::__cxx11::string::_M_construct<char*>((string *)&local_2c8,psVar2);
    local_2a8 = 0;
    local_220._0_4_ = local_2d0._0_4_;
    local_218._M_p = (pointer)&local_208;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_218,local_2c8._M_dataplus._M_p,
               local_2c8._M_string_length + local_2c8._M_dataplus._M_p);
    local_208.field_2._M_allocated_capacity._0_4_ = local_2a8;
    local_208.field_2._8_8_ = (pointer)0x8;
    local_1e8 = 2;
    local_1e4 = (int)((ulong)((long)pVVar3 - (long)local_1d8) >> 3);
    local_1e0 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    pRVar4 = local_278;
    if (local_2a0 != psVar2) {
      operator_delete(local_2a0,local_298._M_string_length + 1);
    }
    local_2d0._0_4_ = PRIMITIVETYPE_TRIANGLES;
    local_2d0._4_4_ =
         (undefined4)
         ((ulong)((long)local_2e8.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)local_2e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 1);
    local_2c8._M_dataplus._M_p._0_4_ = 1;
    local_2c8._M_string_length =
         (size_type)
         local_2e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_start;
    glu::draw(renderCtx,local_100.m_program.m_program,1,(VertexArrayBinding *)local_220,
              (PrimitiveList *)local_2d0,(DrawUtilCallback *)0x0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218._M_p !=
        &local_208) {
      operator_delete(local_218._M_p,
                      CONCAT17(local_208._M_dataplus._M_p._7_1_,
                               CONCAT16(local_208._M_dataplus._M_p._6_1_,
                                        local_208._M_dataplus._M_p._0_6_)) + 1);
    }
    (**(code **)(lVar11 + 0x4e8))(0xb90);
    pFVar7 = local_270;
    if (local_2e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_2e8.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2e8.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((pointer)local_308.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_308.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_308.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_308.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((pointer)local_328._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ - local_328._0_8_);
    }
    glu::ShaderProgram::~ShaderProgram(&local_100);
    (*pFVar7->framebufferRenderbuffer)(0x8d40,0x821a,0x8d41,0);
    checkFramebufferStatus(pFVar7);
    blitStencilToColor2D(renderCtx,local_268.m_object,0x75,0xc1);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_100,&local_128);
    glu::readPixels(renderCtx,0,0,(PixelBufferAccess *)&local_100);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_100,&local_150);
    renderTestPatternReference((PixelBufferAccess *)&local_100);
    log = ((pRVar4->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&local_100,&local_150);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)local_220,&local_128);
    bVar5 = compareStencilToRed(log,(ConstPixelBufferAccess *)&local_100,
                                (ConstPixelBufferAccess *)local_220);
    description = "Image comparison failed";
    if (bVar5) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((pRVar4->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar5,
               description);
    tcu::TextureLevel::~TextureLevel(&local_150);
    tcu::TextureLevel::~TextureLevel(&local_128);
    glu::ObjectWrapper::~ObjectWrapper(&local_268);
    glu::ObjectWrapper::~ObjectWrapper(&local_250);
    glu::ObjectWrapper::~ObjectWrapper(&local_238);
    return STOP;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  local_220 = (undefined1  [8])local_210;
  local_210._0_6_ = 0x6c69706d6f43;
  local_210._6_2_ = 0x2065;
  local_208._M_dataplus._M_p._0_6_ = 0x64656c696166;
  local_218._M_p = (pointer)0xe;
  local_208._M_dataplus._M_p._6_1_ = '\0';
  tcu::TestError::TestError(this_00,(string *)local_220);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&	renderCtx		= m_context.getRenderContext();
		const glw::Functions&		gl				= renderCtx.getFunctions();
		const int					width			= 117;
		const int					height			= 193;
		glu::Framebuffer			fbo				(renderCtx);
		glu::Renderbuffer			colorBuf		(renderCtx);
		glu::Texture				depthStencilTex	(renderCtx);
		TextureLevel				result			(TextureFormat(TextureFormat::RGBA, TextureFormat::UNSIGNED_INT32), width, height);
		TextureLevel				reference		(TextureFormat(TextureFormat::S, TextureFormat::UNSIGNED_INT8), width, height);

		checkDepthStencilFormatSupport(m_context, m_format);

		gl.bindRenderbuffer(GL_RENDERBUFFER, *colorBuf);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_R32UI, width, height);

		gl.bindTexture(GL_TEXTURE_2D, *depthStencilTex);
		gl.texStorage2D(GL_TEXTURE_2D, 1, m_format, width, height);

		gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *colorBuf);
		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, GL_TEXTURE_2D, *depthStencilTex, 0);
		checkFramebufferStatus(gl);

		drawTestPattern(renderCtx, width, height);

		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, GL_RENDERBUFFER, 0);
		checkFramebufferStatus(gl);

		blitStencilToColor2D(renderCtx, *depthStencilTex, width, height);
		glu::readPixels(renderCtx, 0, 0, result.getAccess());

		renderTestPatternReference(reference);

		{
			const bool compareOk = compareStencilToRed(m_testCtx.getLog(), reference, result);
			m_testCtx.setTestResult(compareOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL,
									compareOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}